

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageadapter.h
# Opt level: O0

void __thiscall
bgui::ImageAdapter<float>::copyInto(ImageAdapter<float> *this,ImageU8 *rgb,long x,long y)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  double *pdVar7;
  long in_RCX;
  long in_RDX;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *in_RSI;
  long in_RDI;
  double dVar8;
  __type_conflict _Var9;
  int v0;
  double v1;
  double b_2;
  double g_2;
  double r_2;
  double v_1;
  float ys_2;
  float xs_2;
  double b_1;
  double g_1;
  double r_1;
  double v;
  float ys_1;
  float xs_1;
  double b;
  double g;
  double r;
  float ys;
  float xs;
  double xf;
  int i;
  double yf;
  int k;
  double rainbow_size;
  long ih;
  long iw;
  int ib;
  int ig;
  int ir;
  double irange;
  double step;
  undefined4 in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd7c;
  undefined8 in_stack_fffffffffffffd80;
  double in_stack_fffffffffffffd88;
  ulong in_stack_fffffffffffffd90;
  Image<float,_gimage::PixelTraits<float>_> *in_stack_fffffffffffffd98;
  double *in_stack_fffffffffffffdb8;
  double in_stack_fffffffffffffdc0;
  ImageAdapter<float> *in_stack_fffffffffffffdc8;
  double in_stack_fffffffffffffde8;
  double *in_stack_fffffffffffffdf0;
  double *in_stack_fffffffffffffdf8;
  double *in_stack_fffffffffffffe00;
  double *in_stack_fffffffffffffe08;
  ImageAdapter<float> *in_stack_fffffffffffffe10;
  int in_stack_fffffffffffffe20;
  double local_130;
  double local_128;
  double local_120;
  double local_118;
  double local_108;
  double local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  float local_a0;
  float local_9c;
  double local_98;
  double local_90;
  double local_88;
  float local_80;
  float local_7c;
  double *local_78;
  int local_6c;
  double local_68;
  int local_5c;
  __type_conflict local_58;
  long local_50;
  long local_48;
  int local_3c;
  int local_38;
  int local_34;
  double local_30;
  double local_28;
  long local_20;
  long local_18;
  Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *local_10;
  
  iVar2 = (int)((ulong)in_stack_fffffffffffffd80 >> 0x20);
  local_28 = 1.0 / *(double *)(in_RDI + 0x48);
  local_30 = *(double *)(in_RDI + 0x58) - *(double *)(in_RDI + 0x50);
  local_34 = 0;
  local_38 = 1;
  local_3c = 2;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_48 = gimage::Image<float,_gimage::PixelTraits<float>_>::getWidth
                       (*(Image<float,_gimage::PixelTraits<float>_> **)(in_RDI + 0x70));
  local_50 = gimage::Image<float,_gimage::PixelTraits<float>_>::getHeight
                       (*(Image<float,_gimage::PixelTraits<float>_> **)(in_RDI + 0x70));
  local_58 = 1.0;
  if (0.0 < local_30) {
    dVar8 = log(local_30);
    _Var9 = std::log<int>(0);
    floor(dVar8 / _Var9);
    local_58 = std::pow<int,double>
                         (iVar2,(double)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78
                                                ));
  }
  if ((*(uint *)(in_RDI + 0xc) & 1) != 0) {
    local_48 = gimage::Image<float,_gimage::PixelTraits<float>_>::getHeight
                         (*(Image<float,_gimage::PixelTraits<float>_> **)(in_RDI + 0x70));
    local_50 = gimage::Image<float,_gimage::PixelTraits<float>_>::getWidth
                         (*(Image<float,_gimage::PixelTraits<float>_> **)(in_RDI + 0x70));
  }
  iVar2 = gimage::Image<float,_gimage::PixelTraits<float>_>::getDepth
                    (*(Image<float,_gimage::PixelTraits<float>_> **)(in_RDI + 0x70));
  if (iVar2 < 3) {
    local_3c = 0;
    local_38 = 0;
    local_34 = 0;
  }
  if ((-1 < *(int *)(in_RDI + 8)) &&
     (iVar2 = *(int *)(in_RDI + 8),
     iVar3 = gimage::Image<float,_gimage::PixelTraits<float>_>::getDepth
                       (*(Image<float,_gimage::PixelTraits<float>_> **)(in_RDI + 0x70)),
     iVar2 < iVar3)) {
    local_3c = *(int *)(in_RDI + 8);
    local_38 = local_3c;
    local_34 = local_3c;
  }
  for (local_5c = 0; lVar5 = (long)local_5c,
      lVar6 = gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getHeight(local_10)
      , lVar5 < lVar6; local_5c = local_5c + 1) {
    local_68 = (double)(local_20 + local_5c) / *(double *)(in_RDI + 0x48);
    local_6c = 0;
    if ((0.0 <= local_68) && (local_68 < (double)local_50)) {
      local_78 = (double *)((double)local_18 / *(double *)(in_RDI + 0x48));
      while( true ) {
        bVar1 = false;
        if ((double)local_78 < 0.0) {
          lVar5 = (long)local_6c;
          lVar6 = gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getWidth
                            (local_10);
          bVar1 = lVar5 < lVar6;
        }
        if (!bVar1) break;
        gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::set
                  (local_10,(long)local_6c,(long)local_5c,0,'\0');
        gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::set
                  (local_10,(long)local_6c,(long)local_5c,1,'\0');
        gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::set
                  (local_10,(long)local_6c,(long)local_5c,2,'\0');
        local_78 = (double *)(local_28 + (double)local_78);
        local_6c = local_6c + 1;
      }
      if ((local_38 == local_34) && (*(int *)(in_RDI + 0x68) != 0)) {
        if (*(int *)(in_RDI + 0x68) == 1) {
          while( true ) {
            bVar1 = false;
            if ((double)local_78 < (double)local_48) {
              lVar5 = (long)local_6c;
              lVar6 = gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getWidth
                                (local_10);
              bVar1 = lVar5 < lVar6;
            }
            if (!bVar1) break;
            lVar5 = gmath::SMatrix<long,_2,_3>::operator()
                              ((SMatrix<long,_2,_3> *)(in_RDI + 0x18),0,0);
            in_stack_fffffffffffffde8 = (double)lVar5;
            in_stack_fffffffffffffdf0 = local_78;
            lVar5 = gmath::SMatrix<long,_2,_3>::operator()
                              ((SMatrix<long,_2,_3> *)(in_RDI + 0x18),0,1);
            in_stack_fffffffffffffdf8 =
                 (double *)
                 (in_stack_fffffffffffffde8 * (double)in_stack_fffffffffffffdf0 +
                 (double)lVar5 * local_68);
            lVar5 = gmath::SMatrix<long,_2,_3>::operator()
                              ((SMatrix<long,_2,_3> *)(in_RDI + 0x18),0,2);
            local_9c = (float)((double)in_stack_fffffffffffffdf8 + (double)lVar5);
            lVar5 = gmath::SMatrix<long,_2,_3>::operator()
                              ((SMatrix<long,_2,_3> *)(in_RDI + 0x18),1,0);
            in_stack_fffffffffffffe00 = (double *)(double)lVar5;
            in_stack_fffffffffffffe08 = local_78;
            lVar5 = gmath::SMatrix<long,_2,_3>::operator()
                              ((SMatrix<long,_2,_3> *)(in_RDI + 0x18),1,1);
            in_stack_fffffffffffffe10 =
                 (ImageAdapter<float> *)
                 ((double)in_stack_fffffffffffffe00 * (double)in_stack_fffffffffffffe08 +
                 (double)lVar5 * local_68);
            lVar5 = gmath::SMatrix<long,_2,_3>::operator()
                              ((SMatrix<long,_2,_3> *)(in_RDI + 0x18),1,2);
            local_a0 = (float)((double)in_stack_fffffffffffffe10 + (double)lVar5);
            local_a8 = getPixel(in_stack_fffffffffffffdc8,
                                (float)((ulong)in_stack_fffffffffffffdc0 >> 0x20),
                                SUB84(in_stack_fffffffffffffdc0,0),
                                (int)((ulong)in_stack_fffffffffffffdb8 >> 0x20));
            local_b0 = 0.0;
            local_b8 = 0.0;
            local_c0 = 0.0;
            bVar1 = gimage::Image<float,_gimage::PixelTraits<float>_>::isValid
                              (in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,
                               (long)in_stack_fffffffffffffd88);
            if (bVar1) {
              if (local_a8 < *(double *)(in_RDI + 0x50)) {
                local_a8 = -0.05;
              }
              else if (*(double *)(in_RDI + 0x58) < local_a8) {
                local_a8 = 1.05;
              }
              else {
                local_a8 = (local_a8 - *(double *)(in_RDI + 0x50)) / local_30;
                if ((*(double *)(in_RDI + 0x60) != 1.0) || (NAN(*(double *)(in_RDI + 0x60)))) {
                  if ((int)(*(double *)(in_RDI + 0x60) + 0.5) == 2) {
                    local_a8 = sqrt(local_a8);
                  }
                  else if (2 < (int)(*(double *)(in_RDI + 0x60) + 0.5)) {
                    dVar8 = sqrt(local_b0);
                    local_a8 = sqrt(dVar8);
                  }
                }
              }
              local_a8 = local_a8 / 1.15 + 0.1;
              local_c8 = 0.0;
              local_d0 = 1.0;
              local_d8 = ABS(local_a8 - 0.75) * -4.0 + 1.5;
              pdVar7 = std::min<double>(&local_d0,&local_d8);
              pdVar7 = std::max<double>(&local_c8,pdVar7);
              local_b0 = *pdVar7;
              local_e0 = 0.0;
              local_e8 = 1.0;
              local_f0 = ABS(local_a8 - 0.5) * -4.0 + 1.5;
              pdVar7 = std::min<double>(&local_e8,&local_f0);
              pdVar7 = std::max<double>(&local_e0,pdVar7);
              local_b8 = *pdVar7;
              local_f8 = 0.0;
              local_100 = 1.0;
              local_108 = ABS(local_a8 - 0.25) * -4.0 + 1.5;
              pdVar7 = std::min<double>(&local_100,&local_108);
              pdVar7 = std::max<double>(&local_f8,pdVar7);
              local_c0 = *pdVar7;
            }
            gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::set
                      (local_10,(long)local_6c,(long)local_5c,0,
                       (store_t)(int)(local_b0 * 255.0 + 0.5));
            gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::set
                      (local_10,(long)local_6c,(long)local_5c,1,
                       (store_t)(int)(local_b8 * 255.0 + 0.5));
            gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::set
                      (local_10,(long)local_6c,(long)local_5c,2,
                       (store_t)(int)(local_c0 * 255.0 + 0.5));
            local_78 = (double *)(local_28 + (double)local_78);
            local_6c = local_6c + 1;
          }
        }
        else if (*(int *)(in_RDI + 0x68) == 2) {
          while( true ) {
            bVar1 = false;
            if ((double)local_78 < (double)local_48) {
              in_stack_fffffffffffffdc8 = (ImageAdapter<float> *)(long)local_6c;
              lVar5 = gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getWidth
                                (local_10);
              bVar1 = (long)in_stack_fffffffffffffdc8 < lVar5;
            }
            if (!bVar1) break;
            lVar5 = gmath::SMatrix<long,_2,_3>::operator()
                              ((SMatrix<long,_2,_3> *)(in_RDI + 0x18),0,0);
            in_stack_fffffffffffffd98 = (Image<float,_gimage::PixelTraits<float>_> *)(double)lVar5;
            gmath::SMatrix<long,_2,_3>::operator()((SMatrix<long,_2,_3> *)(in_RDI + 0x18),0,1);
            gmath::SMatrix<long,_2,_3>::operator()((SMatrix<long,_2,_3> *)(in_RDI + 0x18),0,2);
            lVar5 = gmath::SMatrix<long,_2,_3>::operator()
                              ((SMatrix<long,_2,_3> *)(in_RDI + 0x18),1,0);
            in_stack_fffffffffffffdb8 = local_78;
            lVar6 = gmath::SMatrix<long,_2,_3>::operator()
                              ((SMatrix<long,_2,_3> *)(in_RDI + 0x18),1,1);
            in_stack_fffffffffffffdc0 =
                 (double)lVar5 * (double)in_stack_fffffffffffffdb8 + (double)lVar6 * local_68;
            gmath::SMatrix<long,_2,_3>::operator()((SMatrix<long,_2,_3> *)(in_RDI + 0x18),1,2);
            local_118 = getPixel(in_stack_fffffffffffffdc8,
                                 (float)((ulong)in_stack_fffffffffffffdc0 >> 0x20),
                                 SUB84(in_stack_fffffffffffffdc0,0),
                                 (int)((ulong)in_stack_fffffffffffffdb8 >> 0x20));
            local_120 = 0.0;
            local_128 = 0.0;
            local_130 = 0.0;
            bVar1 = gimage::Image<float,_gimage::PixelTraits<float>_>::isValid
                              (in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,
                               (long)in_stack_fffffffffffffd88);
            if (bVar1) {
              if (local_118 < *(double *)(in_RDI + 0x50)) {
                local_118 = *(double *)(in_RDI + 0x50);
              }
              if (*(double *)(in_RDI + 0x58) <= local_118 && local_118 != *(double *)(in_RDI + 0x58)
                 ) {
                local_118 = *(double *)(in_RDI + 0x58);
              }
              in_stack_fffffffffffffd88 = local_118 / local_58;
              dVar8 = floor(in_stack_fffffffffffffd88);
              dVar8 = (in_stack_fffffffffffffd88 - dVar8) * 6.0;
              uVar4 = (uint)dVar8;
              dVar8 = dVar8 - (double)(int)uVar4;
              in_stack_fffffffffffffd90 = (ulong)uVar4;
              switch(in_stack_fffffffffffffd90) {
              case 0:
                local_120 = 1.0;
                local_128 = dVar8;
                break;
              case 1:
                local_120 = 1.0 - dVar8;
                local_128 = 1.0;
                break;
              case 2:
                local_128 = 1.0;
                local_130 = dVar8;
                break;
              case 3:
                local_130 = 1.0;
                local_128 = 1.0 - dVar8;
                break;
              case 4:
                local_130 = 1.0;
                local_120 = dVar8;
                break;
              default:
                local_120 = 1.0;
                local_130 = 1.0 - dVar8;
              }
              dVar8 = ((local_118 - *(double *)(in_RDI + 0x50)) * 1.6) / local_30 - 0.8;
              if (0.0 <= dVar8) {
                local_120 = (1.0 - dVar8) * local_120 + dVar8;
                local_128 = (1.0 - dVar8) * local_128 + dVar8;
                local_130 = (1.0 - dVar8) * local_130 + dVar8;
              }
              else {
                local_120 = (dVar8 + 1.0) * local_120;
                local_128 = (dVar8 + 1.0) * local_128;
                local_130 = (dVar8 + 1.0) * local_130;
              }
            }
            gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::set
                      (local_10,(long)local_6c,(long)local_5c,0,
                       (store_t)(int)(local_120 * 255.0 + 0.5));
            gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::set
                      (local_10,(long)local_6c,(long)local_5c,1,
                       (store_t)(int)(local_128 * 255.0 + 0.5));
            gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::set
                      (local_10,(long)local_6c,(long)local_5c,2,
                       (store_t)(int)(local_130 * 255.0 + 0.5));
            local_78 = (double *)(local_28 + (double)local_78);
            local_6c = local_6c + 1;
          }
        }
      }
      else {
        while( true ) {
          bVar1 = false;
          if ((double)local_78 < (double)local_48) {
            lVar5 = (long)local_6c;
            lVar6 = gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getWidth
                              (local_10);
            bVar1 = lVar5 < lVar6;
          }
          if (!bVar1) break;
          lVar5 = gmath::SMatrix<long,_2,_3>::operator()((SMatrix<long,_2,_3> *)(in_RDI + 0x18),0,0)
          ;
          pdVar7 = local_78;
          lVar6 = gmath::SMatrix<long,_2,_3>::operator()((SMatrix<long,_2,_3> *)(in_RDI + 0x18),0,1)
          ;
          dVar8 = (double)lVar6 * local_68;
          lVar6 = gmath::SMatrix<long,_2,_3>::operator()((SMatrix<long,_2,_3> *)(in_RDI + 0x18),0,2)
          ;
          local_7c = (float)((double)lVar5 * (double)pdVar7 + dVar8 + (double)lVar6);
          lVar5 = gmath::SMatrix<long,_2,_3>::operator()((SMatrix<long,_2,_3> *)(in_RDI + 0x18),1,0)
          ;
          pdVar7 = local_78;
          lVar6 = gmath::SMatrix<long,_2,_3>::operator()((SMatrix<long,_2,_3> *)(in_RDI + 0x18),1,1)
          ;
          dVar8 = (double)lVar6 * local_68;
          lVar6 = gmath::SMatrix<long,_2,_3>::operator()((SMatrix<long,_2,_3> *)(in_RDI + 0x18),1,2)
          ;
          local_80 = (float)((double)lVar5 * (double)pdVar7 + dVar8 + (double)lVar6);
          getPixel(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                   in_stack_fffffffffffffdf8,(float)((ulong)in_stack_fffffffffffffdf0 >> 0x20),
                   SUB84(in_stack_fffffffffffffdf0,0),
                   (int)((ulong)in_stack_fffffffffffffde8 >> 0x20),
                   SUB84(in_stack_fffffffffffffde8,0),in_stack_fffffffffffffe20);
          pdVar7 = std::min<double>((double *)(in_RDI + 0x58),&local_88);
          pdVar7 = std::max<double>((double *)(in_RDI + 0x50),pdVar7);
          local_88 = (*pdVar7 - *(double *)(in_RDI + 0x50)) / local_30;
          pdVar7 = std::min<double>((double *)(in_RDI + 0x58),&local_90);
          pdVar7 = std::max<double>((double *)(in_RDI + 0x50),pdVar7);
          local_90 = (*pdVar7 - *(double *)(in_RDI + 0x50)) / local_30;
          pdVar7 = std::min<double>((double *)(in_RDI + 0x58),&local_98);
          pdVar7 = std::max<double>((double *)(in_RDI + 0x50),pdVar7);
          local_98 = (*pdVar7 - *(double *)(in_RDI + 0x50)) / local_30;
          if ((*(double *)(in_RDI + 0x60) != 1.0) || (NAN(*(double *)(in_RDI + 0x60)))) {
            if ((int)(*(double *)(in_RDI + 0x60) + 0.5) == 2) {
              local_88 = sqrt(local_88);
              local_90 = sqrt(local_90);
              local_98 = sqrt(local_98);
            }
            else if (2 < (int)(*(double *)(in_RDI + 0x60) + 0.5)) {
              dVar8 = sqrt(local_88);
              local_88 = sqrt(dVar8);
              dVar8 = sqrt(local_90);
              local_90 = sqrt(dVar8);
              dVar8 = sqrt(local_98);
              local_98 = sqrt(dVar8);
            }
          }
          gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::set
                    (local_10,(long)local_6c,(long)local_5c,0,(store_t)(int)(local_88 * 255.0 + 0.5)
                    );
          gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::set
                    (local_10,(long)local_6c,(long)local_5c,1,(store_t)(int)(local_90 * 255.0 + 0.5)
                    );
          gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::set
                    (local_10,(long)local_6c,(long)local_5c,2,(store_t)(int)(local_98 * 255.0 + 0.5)
                    );
          local_78 = (double *)(local_28 + (double)local_78);
          local_6c = local_6c + 1;
        }
      }
    }
    while( true ) {
      lVar5 = (long)local_6c;
      lVar6 = gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::getWidth(local_10);
      if (lVar6 <= lVar5) break;
      gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::set
                (local_10,(long)local_6c,(long)local_5c,0,'\0');
      gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::set
                (local_10,(long)local_6c,(long)local_5c,1,'\0');
      gimage::Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_>::set
                (local_10,(long)local_6c,(long)local_5c,2,'\0');
      local_6c = local_6c + 1;
    }
  }
  return;
}

Assistant:

void copyInto(gimage::ImageU8 &rgb, long x, long y) const
    {
      const double step=1/scale;
      const double irange=imax-imin;
      int ir=0, ig=1, ib=2;
      long iw=image->getWidth();
      long ih=image->getHeight();
      double rainbow_size=1;

      if (irange > 0)
      {
        rainbow_size=std::pow(10, std::floor(std::log(irange)/std::log(10))-1);
      }

      if ((rotation&1) != 0)
      {
        iw=image->getHeight();
        ih=image->getWidth();
      }

      assert(rgb.getDepth() == 3);

      if (image->getDepth() < 3)
      {
        ir=ig=ib=0;
      }

      if (channel >= 0 && channel < image->getDepth())
      {
        ir=ig=ib=channel;
      }

      for (int k=0; k<rgb.getHeight(); k++)
      {
        double yf=(y+k)/scale;

        int i=0;

        if (yf >= 0 && yf < ih)
        {
          double xf=x/scale;

          while (xf < 0 && i < rgb.getWidth())
          {
            rgb.set(i, k, 0, 0);
            rgb.set(i, k, 1, 0);
            rgb.set(i, k, 2, 0);

            xf+=step;
            i++;
          }

          if (ig != ir || map == map_raw)
          {
            // map color image or greyscale image directly

            while (xf < iw && i < rgb.getWidth())
            {
              float xs=static_cast<float>(R(0, 0)*xf+R(0, 1)*yf+R(0, 2));
              float ys=static_cast<float>(R(1, 0)*xf+R(1, 1)*yf+R(1, 2));

              double r, g, b;
              getPixel(r, g, b, xs, ys, ir, ig, ib);

              r=(std::max(imin, std::min(imax, r))-imin)/irange;
              g=(std::max(imin, std::min(imax, g))-imin)/irange;
              b=(std::max(imin, std::min(imax, b))-imin)/irange;

              if (gamma != 1.0)
              {
                // pow() can be extremly slow and linear lookup tables would be
                // very big for data with higher radiometric depth, thats why we
                // only allow a gamma with root of 2 and 4.

                if (static_cast<int>(gamma+0.5) == 2)
                {
                  r=sqrt(r);
                  g=sqrt(g);
                  b=sqrt(b);
                }
                else if (static_cast<int>(gamma+0.5) >= 3)
                {
                  r=sqrt(sqrt(r));
                  g=sqrt(sqrt(g));
                  b=sqrt(sqrt(b));
                }
              }

              rgb.set(i, k, 0, static_cast<char>(255*r+0.5));
              rgb.set(i, k, 1, static_cast<char>(255*g+0.5));
              rgb.set(i, k, 2, static_cast<char>(255*b+0.5));

              xf+=step;
              i++;
            }
          }
          else if (map == map_jet)
          {
            // map greyscale image using jet encoding

            while (xf < iw && i < rgb.getWidth())
            {
              float xs=static_cast<float>(R(0, 0)*xf+R(0, 1)*yf+R(0, 2));
              float ys=static_cast<float>(R(1, 0)*xf+R(1, 1)*yf+R(1, 2));

              double v=getPixel(xs, ys, ir);
              double r=0.0;
              double g=0.0;
              double b=0.0;

              if (image->isValid(static_cast<long>(xs), static_cast<long>(ys)))
              {
                if (v >= imin)
                {
                  if (v <= imax)
                  {
                    v=(v-imin)/irange;

                    if (gamma != 1.0)
                    {
                      // pow() can be extremly slow and linear lookup tables would be
                      // very big for data with higher radiometric depth, thats why we
                      // only allow a gamma with root of 2 and 4.

                      if (static_cast<int>(gamma+0.5) == 2)
                      {
                        v=sqrt(v);
                      }
                      else if (static_cast<int>(gamma+0.5) >= 3)
                      {
                        v=sqrt(sqrt(r));
                      }
                    }
                  }
                  else
                  {
                    v=1.05;
                  }
                }
                else
                {
                  v=-0.05;
                }

                v=v/1.15+0.1;
                r=std::max(0.0, std::min(1.0, (1.5 - 4*fabs(v-0.75))));
                g=std::max(0.0, std::min(1.0, (1.5 - 4*fabs(v-0.5))));
                b=std::max(0.0, std::min(1.0, (1.5 - 4*fabs(v-0.25))));
              }

              rgb.set(i, k, 0, static_cast<char>(255*r+0.5));
              rgb.set(i, k, 1, static_cast<char>(255*g+0.5));
              rgb.set(i, k, 2, static_cast<char>(255*b+0.5));

              xf+=step;
              i++;
            }
          }
          else if (map == map_rainbow)
          {
            while (xf < iw && i < rgb.getWidth())
            {
              float xs=static_cast<float>(R(0, 0)*xf+R(0, 1)*yf+R(0, 2));
              float ys=static_cast<float>(R(1, 0)*xf+R(1, 1)*yf+R(1, 2));

              double v=getPixel(xs, ys, ir);
              double r=0.0;
              double g=0.0;
              double b=0.0;

              if (image->isValid(static_cast<long>(xs), static_cast<long>(ys)))
              {
                if (v < imin)
                {
                  v=imin;
                }

                if (v > imax)
                {
                  v=imax;
                }

                // compute color

                double v1=v/rainbow_size;

                v1=6.0*(v1-floor(v1));

                int v0=static_cast<int>(v1);

                v1-=v0;

                switch (v0)
                {
                  case 0:
                    r=1.0;
                    g=v1;
                    break;

                  case 1:
                    r=1.0-v1;
                    g=1.0;
                    break;

                  case 2:
                    g=1.0;
                    b=v1;
                    break;

                  case 3:
                    g=1.0-v1;
                    b=1.0;
                    break;

                  case 4:
                    b=1.0;
                    r=v1;
                    break;

                  default:
                    b=1.0-v1;
                    r=1.0;
                    break;
                }

                // compute brightness

                v=1.6*(v-imin)/irange-0.8;

                if (v < 0)
                {
                  r*=v+1;
                  g*=v+1;
                  b*=v+1;
                }
                else
                {
                  r=(1-v)*r+v;
                  g=(1-v)*g+v;
                  b=(1-v)*b+v;
                }
              }

              rgb.set(i, k, 0, static_cast<int>(255*r+0.5));
              rgb.set(i, k, 1, static_cast<int>(255*g+0.5));
              rgb.set(i, k, 2, static_cast<int>(255*b+0.5));

              xf+=step;
              i++;
            }
          }
        }

        while (i < rgb.getWidth())
        {
          rgb.set(i, k, 0, 0);
          rgb.set(i, k, 1, 0);
          rgb.set(i, k, 2, 0);

          i++;
        }
      }
    }